

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

vector<CKeyID,_std::allocator<CKeyID>_> *
wallet::GetAffectedKeys(CScript *spk,SigningProvider *provider)

{
  bool bVar1;
  pointer pDVar2;
  vector<CKeyID,_std::allocator<CKeyID>_> *in_RDX;
  vector<CKeyID,_std::allocator<CKeyID>_> *in_RDI;
  long in_FS_OFFSET;
  pair<const_CKeyID,_CPubKey> *entry;
  map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  *__range1;
  vector<CKeyID,_std::allocator<CKeyID>_> *ret;
  iterator __end1;
  iterator __begin1;
  vector<CScript,_std::allocator<CScript>_> dummy;
  FlatSigningProvider out;
  FlatSigningProvider *in_stack_fffffffffffffe78;
  map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  *in_stack_fffffffffffffe80;
  vector<CKeyID,_std::allocator<CKeyID>_> *provider_00;
  CScript *in_stack_fffffffffffffe98;
  size_type in_stack_fffffffffffffeb0;
  undefined1 local_118 [24];
  undefined1 local_100 [248];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  provider_00 = in_RDI;
  std::vector<CScript,_std::allocator<CScript>_>::vector
            ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffffe78);
  FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffffe78);
  InferDescriptor(in_stack_fffffffffffffe98,(SigningProvider *)provider_00);
  pDVar2 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                     ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                      in_stack_fffffffffffffe78);
  (*pDVar2->_vptr_Descriptor[8])(pDVar2,0,DUMMY_SIGNING_PROVIDER,local_118,local_100,0);
  std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::~unique_ptr
            ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)in_RDI);
  std::vector<CKeyID,_std::allocator<CKeyID>_>::vector
            ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_fffffffffffffe78);
  std::map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>::
  size((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
        *)in_stack_fffffffffffffe78);
  std::vector<CKeyID,_std::allocator<CKeyID>_>::reserve(in_RDX,in_stack_fffffffffffffeb0);
  std::map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>::
  begin(in_stack_fffffffffffffe80);
  std::map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>::
  end(in_stack_fffffffffffffe80);
  while (bVar1 = std::operator==((_Self *)in_RDI,(_Self *)in_stack_fffffffffffffe80),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_> *)in_stack_fffffffffffffe78);
    std::vector<CKeyID,_std::allocator<CKeyID>_>::push_back
              (in_RDI,(value_type *)in_stack_fffffffffffffe80);
    std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_> *)in_stack_fffffffffffffe78);
  }
  FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffffe78);
  std::vector<CScript,_std::allocator<CScript>_>::~vector
            ((vector<CScript,_std::allocator<CScript>_> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return provider_00;
}

Assistant:

std::vector<CKeyID> GetAffectedKeys(const CScript& spk, const SigningProvider& provider)
{
    std::vector<CScript> dummy;
    FlatSigningProvider out;
    InferDescriptor(spk, provider)->Expand(0, DUMMY_SIGNING_PROVIDER, dummy, out);
    std::vector<CKeyID> ret;
    ret.reserve(out.pubkeys.size());
    for (const auto& entry : out.pubkeys) {
        ret.push_back(entry.first);
    }
    return ret;
}